

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void cmSystemTools::ParseWindowsCommandLine
               (char *command,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  bool bVar5;
  char *c;
  string arg;
  
  arg._M_dataplus._M_p = (pointer)&arg.field_2;
  arg._M_string_length = 0;
  arg.field_2._M_local_buf[0] = '\0';
  uVar4 = 0;
  bVar5 = false;
  bVar2 = false;
  do {
    cVar1 = *command;
    if (cVar1 == '\"') {
      std::__cxx11::string::append((ulong)&arg,(char)((int)uVar4 >> 1));
      if ((uVar4 & 1) == 0) {
        bVar5 = (bool)(bVar5 ^ 1);
      }
      else {
        std::__cxx11::string::append((ulong)&arg,'\x01');
      }
LAB_001619a4:
      bVar2 = true;
LAB_001619a7:
      uVar4 = 0;
    }
    else {
      if (cVar1 != '\\') {
        if (cVar1 == '\0') {
          std::__cxx11::string::append((ulong)&arg,(char)uVar4);
          if (bVar2) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(args,&arg);
          }
          std::__cxx11::string::~string((string *)&arg);
          return;
        }
        std::__cxx11::string::append((ulong)&arg,(char)uVar4);
        bVar3 = cm_isspace(*command);
        if (!bVar3) {
          std::__cxx11::string::append((ulong)&arg,'\x01');
          goto LAB_001619a4;
        }
        if (!bVar5) {
          uVar4 = 0;
          bVar5 = false;
          if (bVar2) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(args,&arg);
            arg._M_string_length = 0;
            *arg._M_dataplus._M_p = '\0';
            uVar4 = 0;
            bVar5 = false;
            bVar2 = false;
          }
          goto LAB_001619a9;
        }
        std::__cxx11::string::append((ulong)&arg,'\x01');
        bVar5 = true;
        goto LAB_001619a7;
      }
      uVar4 = uVar4 + 1;
      bVar2 = true;
    }
LAB_001619a9:
    command = command + 1;
  } while( true );
}

Assistant:

void cmSystemTools::ParseWindowsCommandLine(const char* command,
                                            std::vector<std::string>& args)
{
  // See the MSDN document "Parsing C Command-Line Arguments" at
  // http://msdn2.microsoft.com/en-us/library/a1y7w461.aspx for rules
  // of parsing the windows command line.

  bool in_argument = false;
  bool in_quotes = false;
  int backslashes = 0;
  std::string arg;
  for (const char* c = command; *c; ++c) {
    if (*c == '\\') {
      ++backslashes;
      in_argument = true;
    } else if (*c == '"') {
      int backslash_pairs = backslashes >> 1;
      int backslash_escaped = backslashes & 1;
      arg.append(backslash_pairs, '\\');
      backslashes = 0;
      if (backslash_escaped) {
        /* An odd number of backslashes precede this quote.
           It is escaped.  */
        arg.append(1, '"');
      } else {
        /* An even number of backslashes precede this quote.
           It is not escaped.  */
        in_quotes = !in_quotes;
      }
      in_argument = true;
    } else {
      arg.append(backslashes, '\\');
      backslashes = 0;
      if (cm_isspace(*c)) {
        if (in_quotes) {
          arg.append(1, *c);
        } else if (in_argument) {
          args.push_back(arg);
          arg.clear();
          in_argument = false;
        }
      } else {
        in_argument = true;
        arg.append(1, *c);
      }
    }
  }
  arg.append(backslashes, '\\');
  if (in_argument) {
    args.push_back(arg);
  }
}